

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O2

void __thiscall Assimp::StepExporter::WriteFile(StepExporter *this)

{
  undefined1 *puVar1;
  string *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  aiFace *paVar9;
  aiVector3D *paVar10;
  aiColor4D *paVar11;
  uint *puVar12;
  iterator iVar13;
  mapped_type_conflict *pmVar14;
  tm *__tp;
  ostream *poVar15;
  mapped_type *pMatrix;
  _Base_ptr p_Var16;
  long lVar17;
  aiMesh *paVar18;
  uint i;
  ulong uVar19;
  uint j;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  aiVector3t<float> aVar27;
  aiVector3D *v_1;
  float local_148;
  StepExporter *local_140;
  ulong local_138;
  float local_12c;
  _Base_ptr local_128;
  _Base_ptr local_120;
  aiVector3D *v3;
  aiVector3t<float> local_110;
  aiVector3t<float> local_100;
  aiVector3t<float> local_f0;
  aiVector3D *v1;
  undefined1 local_d8 [24];
  aiMesh *local_c0;
  long local_b8;
  aiVector3D *v2;
  undefined8 local_a8;
  ulong local_90;
  char date_str [20];
  VectorIndexUMap uniqueVerts;
  time_t date;
  
  *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) =
       *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) | 4;
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar25 = 0;
  local_140 = this;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar19 = 0; uVar19 < local_140->mScene->mNumMeshes; uVar19 = uVar19 + 1) {
    paVar18 = local_140->mScene->mMeshes[uVar19];
    for (lVar17 = 0; (ulong)paVar18->mNumFaces << 4 != lVar17; lVar17 = lVar17 + 0x10) {
      uVar25 = uVar25 + (*(int *)((long)&paVar18->mFaces->mNumIndices + lVar17) == 3);
    }
    lVar17 = 0;
    for (uVar21 = 0; uVar21 < paVar18->mNumVertices; uVar21 = uVar21 + 1) {
      date_str._0_8_ = (long)&paVar18->mVertices->x + lVar17;
      iVar13 = std::
               _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
               ::find(&uniqueVerts._M_t,(key_type *)date_str);
      if ((_Rb_tree_header *)iVar13._M_node == &uniqueVerts._M_t._M_impl.super__Rb_tree_header) {
        pmVar14 = std::
                  map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                  ::operator[]((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                                *)&uniqueVerts._M_t,(key_type *)date_str);
        *pmVar14 = -1;
      }
      lVar17 = lVar17 + 0xc;
    }
  }
  date = time((time_t *)0x0);
  __tp = localtime(&date);
  strftime(date_str,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  puVar1 = &local_140->field_0x10;
  poVar15 = std::operator<<((ostream *)puVar1,"ISO-10303-21");
  psVar2 = &local_140->endstr;
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"HEADER");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"FILE_DESCRIPTION((\'STEP AP214\'),\'1\')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"FILE_NAME(\'");
  poVar15 = std::operator<<(poVar15,(string *)&local_140->mFile);
  poVar15 = std::operator<<(poVar15,".stp\',\'");
  poVar15 = std::operator<<(poVar15,date_str);
  poVar15 = std::operator<<(poVar15,"\',(\' \'),(\' \'),\'Spatial InterOp 3D\',\' \',\' \')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"FILE_SCHEMA((\'automotive_design\'))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"ENDSEC");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"DATA");
  std::operator<<(poVar15,(string *)psVar2);
  std::operator<<((ostream *)puVar1,
                  "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(\' \',(");
  uVar21 = 0;
  uVar19 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar19 = uVar21;
  }
  lVar17 = (ulong)(uVar25 - 1) * 0x1e;
  for (; uVar19 * 0x1e - uVar21 != 0; uVar21 = uVar21 + 0x1e) {
    poVar15 = std::operator<<((ostream *)puVar1,"#");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    if (lVar17 - uVar21 != 0) {
      std::operator<<((ostream *)puVar1,",");
    }
  }
  poVar15 = std::operator<<((ostream *)puVar1,"),#6)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#2=PRODUCT_DEFINITION_CONTEXT(\'\',#7,\'design\')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#3=APPLICATION_PROTOCOL_DEFINITION(\'INTERNATIONAL STANDARD\',\'automotive_design\',1994,#7)"
                           );
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#4=PRODUCT_CATEGORY_RELATIONSHIP(\'NONE\',\'NONE\',#8,#9)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT(\'NONE\',\'WORKSPACE\'))"
                           );
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#7=APPLICATION_CONTEXT(\' \')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#8=PRODUCT_CATEGORY(\'part\',\'NONE\')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#9=PRODUCT_RELATED_PRODUCT_CATEGORY(\'detail\',\' \',(#17))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#10=PRODUCT_DEFINITION_SHAPE(\'NONE\',\'NONE\',#18)")
  ;
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION(\'Root\',(#16,#19),#6)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,\'\',\'\')"
                           );
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#13=(CONVERSION_BASED_UNIT(\'METRE\',#20)LENGTH_UNIT()NAMED_UNIT(#21))"
                           );
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#16=SHELL_BASED_SURFACE_MODEL(\'Root\',(#29))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#17=PRODUCT(\'Root\',\'Root\',\'Root\',(#23))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#18=PRODUCT_DEFINITION(\'NONE\',\'NONE\',#24,#2)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#19=AXIS2_PLACEMENT_3D(\'\',#25,#26,#27)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#23=PRODUCT_CONTEXT(\'\',#7,\'mechanical\')");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(\' \',\'NONE\',#17,.NOT_KNOWN.)"
                           );
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#25=CARTESIAN_POINT(\'\',(0.0,0.0,0.0))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#26=DIRECTION(\'\',(0.0,0.0,1.0))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"#27=DIRECTION(\'\',(1.0,0.0,0.0))");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,
                            "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))");
  std::operator<<(poVar15,(string *)psVar2);
  std::operator<<((ostream *)puVar1,"#29=CLOSED_SHELL(\'\',(");
  for (lVar23 = 0; uVar19 * 0x1e - lVar23 != 0; lVar23 = lVar23 + 0x1e) {
    poVar15 = std::operator<<((ostream *)puVar1,"#");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    if (lVar17 - lVar23 != 0) {
      std::operator<<((ostream *)puVar1,",");
    }
  }
  poVar15 = std::operator<<((ostream *)puVar1,"))");
  std::operator<<(poVar15,(string *)psVar2);
  local_128 = &(local_140->meshes)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8._0_8_ = &local_140->trafos;
  iVar20 = 100;
  p_Var16 = (local_140->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var16 != local_128) {
    paVar18 = local_140->mScene->mMeshes[*(uint *)&p_Var16[1]._M_parent];
    v_1 = (aiVector3D *)*(undefined8 *)(p_Var16 + 1);
    local_120 = p_Var16;
    pMatrix = std::
              map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
              ::operator[]((map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
                            *)local_d8._0_8_,(key_type *)&v_1);
    lVar17 = 0;
    for (uVar19 = 0; uVar19 < paVar18->mNumVertices; uVar19 = uVar19 + 1) {
      v_1 = (aiVector3D *)((long)&paVar18->mVertices->x + lVar17);
      iVar13 = std::
               _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
               ::find(&uniqueVerts._M_t,&v_1);
      if (*(int *)&iVar13._M_node[1]._M_parent < 0) {
        *(int *)&iVar13._M_node[1]._M_parent = iVar20;
        aVar27 = ::operator*(pMatrix,v_1);
        local_a8 = aVar27._0_8_;
        local_138 = CONCAT44(local_138._4_4_,aVar27.z);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,*(int *)&iVar13._M_node[1]._M_parent);
        poVar15 = std::operator<<(poVar15,"=CARTESIAN_POINT(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(float)local_a8);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_a8._4_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(float)local_138);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)
                  std::ostream::operator<<(poVar15,*(int *)&iVar13._M_node[1]._M_parent + 1);
        poVar15 = std::operator<<(poVar15,"=VERTEX_POINT(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,*(int *)&iVar13._M_node[1]._M_parent);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        iVar20 = iVar20 + 2;
      }
      lVar17 = lVar17 + 0xc;
    }
    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_120);
  }
  local_d8._0_16_ = ZEXT816(0x3f4ccccd3f4ccccd);
  local_12c = 0.8;
  uVar19 = 0;
  while (uVar19 < local_140->mScene->mNumMeshes) {
    paVar18 = local_140->mScene->mMeshes[uVar19];
    lVar17 = 8;
    local_c0 = paVar18;
    local_90 = uVar19;
    for (local_a8 = 0; local_a8 < paVar18->mNumFaces; local_a8 = local_a8 + 1) {
      paVar9 = paVar18->mFaces;
      if (*(int *)((long)paVar9 + lVar17 + -8) == 3) {
        paVar10 = paVar18->mVertices;
        v1 = paVar10 + **(uint **)((long)&paVar9->mNumIndices + lVar17);
        v2 = paVar10 + *(uint *)(*(long *)((long)&paVar9->mNumIndices + lVar17) + 4);
        v3 = paVar10 + *(uint *)(*(long *)((long)&paVar9->mNumIndices + lVar17) + 8);
        local_b8 = lVar17;
        _v_1 = operator-(v2,v1);
        local_f0 = operator-(v3,v2);
        local_100 = operator-(v1,v3);
        local_110 = operator-(v3,v1);
        aiVector3t<float>::Normalize((aiVector3t<float> *)&v_1);
        aiVector3t<float>::Normalize(&local_f0);
        aiVector3t<float>::Normalize(&local_100);
        aiVector3t<float>::Normalize(&local_110);
        iVar13 = std::
                 _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                 ::find(&uniqueVerts._M_t,&v1);
        local_138 = (ulong)*(uint *)&iVar13._M_node[1]._M_parent;
        iVar13 = std::
                 _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                 ::find(&uniqueVerts._M_t,&v2);
        local_120 = (_Base_ptr)(ulong)*(uint *)&iVar13._M_node[1]._M_parent;
        iVar13 = std::
                 _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                 ::find(&uniqueVerts._M_t,&v3);
        paVar11 = local_c0->mColors[0];
        if ((paVar11 != (aiColor4D *)0x0) && (local_c0->mNumVertices != 0)) {
          puVar12 = *(uint **)((long)&paVar9->mNumIndices + local_b8);
          uVar3 = paVar11[*puVar12].r;
          uVar6 = paVar11[*puVar12].g;
          uVar4 = paVar11[puVar12[1]].r;
          uVar7 = paVar11[puVar12[1]].g;
          uVar5 = paVar11[puVar12[2]].r;
          uVar8 = paVar11[puVar12[2]].g;
          auVar26._0_4_ = (float)uVar5 + (float)uVar4 + (float)uVar3 + 0.0;
          auVar26._4_4_ = (float)uVar8 + (float)uVar7 + (float)uVar6 + 0.0;
          auVar26._8_8_ = 0;
          local_d8._0_16_ = divps(auVar26,_DAT_005c8350);
          local_12c = (paVar11[*puVar12].b + 0.0 + paVar11[puVar12[1]].b + paVar11[puVar12[2]].b) /
                      3.0;
        }
        local_128 = (_Base_ptr)(ulong)*(uint *)&iVar13._M_node[1]._M_parent;
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20);
        poVar15 = std::operator<<(poVar15,"=STYLED_ITEM(\'\',(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 1);
        poVar15 = std::operator<<(poVar15,"),#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 8);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 1);
        poVar15 = std::operator<<(poVar15,"=PRESENTATION_STYLE_ASSIGNMENT((#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 2);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 2);
        poVar15 = std::operator<<(poVar15,"=SURFACE_STYLE_USAGE(.BOTH.,#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 3);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 3);
        poVar15 = std::operator<<(poVar15,"=SURFACE_SIDE_STYLE(\'\',(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 4);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 4);
        poVar15 = std::operator<<(poVar15,"=SURFACE_STYLE_FILL_AREA(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 5);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 5);
        poVar15 = std::operator<<(poVar15,"=FILL_AREA_STYLE(\'\',(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 6);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 6);
        poVar15 = std::operator<<(poVar15,"=FILL_AREA_STYLE_COLOUR(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 7);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 7);
        poVar15 = std::operator<<(poVar15,"=COLOUR_RGB(\'\',");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(float)local_d8._0_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(float)local_d8._4_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_12c);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 8);
        poVar15 = std::operator<<(poVar15,"=FACE_SURFACE(\'\',(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xd);
        poVar15 = std::operator<<(poVar15,"),#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 9);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 9);
        poVar15 = std::operator<<(poVar15,"=PLANE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 10);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 10);
        poVar15 = std::operator<<(poVar15,"=AXIS2_PLACEMENT_3D(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_138);
        poVar15 = std::operator<<(poVar15,", #");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xb);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xc);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xb);
        poVar15 = std::operator<<(poVar15,"=DIRECTION(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,v_1._0_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,v_1._4_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_148);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xc);
        poVar15 = std::operator<<(poVar15,"=DIRECTION(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_110.x);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_110.y);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_110.z);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xd);
        poVar15 = std::operator<<(poVar15,"=FACE_BOUND(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xe);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xe);
        poVar15 = std::operator<<(poVar15,"=EDGE_LOOP(\'\',(#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xf);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x10);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x11);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0xf);
        poVar15 = std::operator<<(poVar15,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x12);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x10);
        poVar15 = std::operator<<(poVar15,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x13);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x11);
        poVar15 = std::operator<<(poVar15,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x14);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x12);
        poVar15 = std::operator<<(poVar15,"=EDGE_CURVE(\'\',#");
        iVar22 = (int)local_138 + 1;
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar22);
        poVar15 = std::operator<<(poVar15,",#");
        iVar24 = (int)local_120 + 1;
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar24);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x15);
        poVar15 = std::operator<<(poVar15,",.F.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x13);
        poVar15 = std::operator<<(poVar15,"=EDGE_CURVE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar24);
        poVar15 = std::operator<<(poVar15,",#");
        iVar24 = (int)local_128 + 1;
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar24);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x16);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x14);
        poVar15 = std::operator<<(poVar15,"=EDGE_CURVE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar24);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar22);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x17);
        poVar15 = std::operator<<(poVar15,",.T.)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x15);
        poVar15 = std::operator<<(poVar15,"=LINE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_138);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x18);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x16);
        poVar15 = std::operator<<(poVar15,"=LINE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_120);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x19);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x17);
        poVar15 = std::operator<<(poVar15,"=LINE(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_128);
        poVar15 = std::operator<<(poVar15,",#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1a);
        poVar15 = std::operator<<(poVar15,")");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x18);
        poVar15 = std::operator<<(poVar15,"=VECTOR(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1b);
        poVar15 = std::operator<<(poVar15,",1.0)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x19);
        poVar15 = std::operator<<(poVar15,"=VECTOR(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1c);
        poVar15 = std::operator<<(poVar15,",1.0)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1a);
        poVar15 = std::operator<<(poVar15,"=VECTOR(\'\',#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1d);
        poVar15 = std::operator<<(poVar15,",1.0)");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1b);
        poVar15 = std::operator<<(poVar15,"=DIRECTION(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,v_1._0_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,v_1._4_4_);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_148);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1c);
        poVar15 = std::operator<<(poVar15,"=DIRECTION(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_f0.x);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_f0.y);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_f0.z);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        poVar15 = std::operator<<((ostream *)puVar1,"#");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar20 + 0x1d);
        poVar15 = std::operator<<(poVar15,"=DIRECTION(\'\',(");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_100.x);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_100.y);
        poVar15 = std::operator<<(poVar15,",");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_100.z);
        poVar15 = std::operator<<(poVar15,"))");
        std::operator<<(poVar15,(string *)psVar2);
        iVar20 = iVar20 + 0x1e;
        paVar18 = local_c0;
        lVar17 = local_b8;
      }
      lVar17 = lVar17 + 0x10;
    }
    uVar19 = local_90 + 1;
  }
  poVar15 = std::operator<<((ostream *)puVar1,"ENDSEC");
  std::operator<<(poVar15,(string *)psVar2);
  poVar15 = std::operator<<((ostream *)puVar1,"END-ISO-10303-21");
  std::operator<<(poVar15,(string *)psVar2);
  std::
  _Rb_tree<aiVector3t<float>_*,_std::pair<aiVector3t<float>_*const,_int>,_std::_Select1st<std::pair<aiVector3t<float>_*const,_int>_>,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  ::~_Rb_tree(&uniqueVerts._M_t);
  return;
}

Assistant:

void StepExporter::WriteFile()
{
    // see http://shodhganga.inflibnet.ac.in:8080/jspui/bitstream/10603/14116/11/11_chapter%203.pdf
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    // precision for double
    // see http://stackoverflow.com/questions/554063/how-do-i-print-a-double-value-with-full-precision-using-cout
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // standard color
    aiColor4D fColor;
    fColor.r = 0.8f;
    fColor.g = 0.8f;
    fColor.b = 0.8f;

    int ind = 100; // the start index to be used
    int faceEntryLen = 30; // number of entries for a triangle/face
    // prepare unique (count triangles and vertices)

    VectorIndexUMap uniqueVerts; // use a map to reduce find complexity to log(n)
    VectorIndexUMap::iterator it;
    int countFace = 0;

    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices == 3) countFace++;
        }
        for (unsigned int j=0; j<mesh->mNumVertices; ++j)
        {
            aiVector3D* v = &(mesh->mVertices[j]);
            it =uniqueVerts.find(v);
            if (it == uniqueVerts.end())
            {
                uniqueVerts[v] = -1; // first mark the vector as not transformed
            }
        }
    }

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    // write the header
    mOutput << "ISO-10303-21" << endstr;
    mOutput << "HEADER" << endstr;
    mOutput << "FILE_DESCRIPTION(('STEP AP214'),'1')" << endstr;
    mOutput << "FILE_NAME('" << mFile << ".stp','" << date_str << "',(' '),(' '),'Spatial InterOp 3D',' ',' ')" << endstr;
    mOutput << "FILE_SCHEMA(('automotive_design'))" << endstr;
    mOutput << "ENDSEC" << endstr;

    // write the top of data
    mOutput << "DATA" << endstr;
    mOutput << "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(' ',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size();
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "),#6)" << endstr;

    mOutput << "#2=PRODUCT_DEFINITION_CONTEXT('',#7,'design')" << endstr;
    mOutput << "#3=APPLICATION_PROTOCOL_DEFINITION('INTERNATIONAL STANDARD','automotive_design',1994,#7)" << endstr;
    mOutput << "#4=PRODUCT_CATEGORY_RELATIONSHIP('NONE','NONE',#8,#9)" << endstr;
    mOutput << "#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)" << endstr;
    mOutput << "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT('NONE','WORKSPACE'))" << endstr;
    mOutput << "#7=APPLICATION_CONTEXT(' ')" << endstr;
    mOutput << "#8=PRODUCT_CATEGORY('part','NONE')" << endstr;
    mOutput << "#9=PRODUCT_RELATED_PRODUCT_CATEGORY('detail',' ',(#17))" << endstr;
    mOutput << "#10=PRODUCT_DEFINITION_SHAPE('NONE','NONE',#18)" << endstr;
    mOutput << "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION('Root',(#16,#19),#6)" << endstr;
    mOutput << "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,'','')" << endstr;
    mOutput << "#13=(CONVERSION_BASED_UNIT('METRE',#20)LENGTH_UNIT()NAMED_UNIT(#21))" << endstr;
    mOutput << "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))" << endstr;
    mOutput << "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))" << endstr;
    mOutput << "#16=SHELL_BASED_SURFACE_MODEL('Root',(#29))" << endstr;
    mOutput << "#17=PRODUCT('Root','Root','Root',(#23))" << endstr;
    mOutput << "#18=PRODUCT_DEFINITION('NONE','NONE',#24,#2)" << endstr;
    mOutput << "#19=AXIS2_PLACEMENT_3D('',#25,#26,#27)" << endstr;
    mOutput << "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)" << endstr;
    mOutput << "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#23=PRODUCT_CONTEXT('',#7,'mechanical')" << endstr;
    mOutput << "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(' ','NONE',#17,.NOT_KNOWN.)" << endstr;
    mOutput << "#25=CARTESIAN_POINT('',(0.0,0.0,0.0))" << endstr;
    mOutput << "#26=DIRECTION('',(0.0,0.0,1.0))" << endstr;
    mOutput << "#27=DIRECTION('',(1.0,0.0,0.0))" << endstr;
    mOutput << "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))" << endstr;
    mOutput << "#29=CLOSED_SHELL('',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size() + 8;
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "))" << endstr;

    // write all the unique transformed CARTESIAN and VERTEX
    for (MeshesByNodeMap::const_iterator it2 = meshes.begin(); it2 != meshes.end(); ++it2)
    {
        const aiNode& node = *(*it2).first;
        unsigned int mesh_idx = (*it2).second;

        const aiMesh* mesh = mScene->mMeshes[mesh_idx];
        aiMatrix4x4& trafo = trafos[&node];
        for (unsigned int i = 0; i < mesh->mNumVertices; ++i)
        {
            aiVector3D* v = &(mesh->mVertices[i]);
            it = uniqueVerts.find(v);
            if (it->second >=0 ) continue;
            it->second = ind; // this one is new, so set the index (ind)
            aiVector3D vt = trafo * (*v); // transform the coordinate
            mOutput << "#" << it->second << "=CARTESIAN_POINT('',(" << vt.x << "," << vt.y << "," << vt.z << "))" << endstr;
            mOutput << "#" << it->second+1 << "=VERTEX_POINT('',#" << it->second << ")" << endstr;
            ind += 2;
        }
    }

    // write the triangles
    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices != 3) continue;

            aiVector3D* v1 = &(mesh->mVertices[face->mIndices[0]]);
            aiVector3D* v2 = &(mesh->mVertices[face->mIndices[1]]);
            aiVector3D* v3 = &(mesh->mVertices[face->mIndices[2]]);
            aiVector3D dv12 = *v2 - *v1;
            aiVector3D dv23 = *v3 - *v2;
            aiVector3D dv31 = *v1 - *v3;
            aiVector3D dv13 = *v3 - *v1;
            dv12.Normalize();
            dv23.Normalize();
            dv31.Normalize();
            dv13.Normalize();

            int pid1 = uniqueVerts.find(v1)->second;
            int pid2 = uniqueVerts.find(v2)->second;
            int pid3 = uniqueVerts.find(v3)->second;

            // mean vertex color for the face if available
            if (mesh->HasVertexColors(0))
            {
                fColor.r = 0.0;
                fColor.g = 0.0;
                fColor.b = 0.0;
                fColor += mesh->mColors[0][face->mIndices[0]];
                fColor += mesh->mColors[0][face->mIndices[1]];
                fColor += mesh->mColors[0][face->mIndices[2]];
                fColor /= 3.0f;
            }

            int sid = ind; // the sub index
            mOutput << "#" << sid << "=STYLED_ITEM('',(#" << sid+1 << "),#" << sid+8 << ")" << endstr; /* the item that must be referenced in #1 */
            /* This is the color information of the Triangle */
            mOutput << "#" << sid+1 << "=PRESENTATION_STYLE_ASSIGNMENT((#" << sid+2 << "))" << endstr;
            mOutput << "#" << sid+2 << "=SURFACE_STYLE_USAGE(.BOTH.,#" << sid+3 << ")" << endstr;
            mOutput << "#" << sid+3 << "=SURFACE_SIDE_STYLE('',(#" << sid+4 << "))" << endstr;
            mOutput << "#" << sid+4 << "=SURFACE_STYLE_FILL_AREA(#" << sid+5 << ")" << endstr;
            mOutput << "#" << sid+5 << "=FILL_AREA_STYLE('',(#" << sid+6 << "))" << endstr;
            mOutput << "#" << sid+6 << "=FILL_AREA_STYLE_COLOUR('',#" << sid+7 << ")" << endstr;
            mOutput << "#" << sid+7 << "=COLOUR_RGB(''," << fColor.r << "," << fColor.g << "," << fColor.b << ")" << endstr;

            /* this is the geometry */
            mOutput << "#" << sid+8 << "=FACE_SURFACE('',(#" << sid+13 << "),#" << sid+9<< ",.T.)" << endstr; /* the face that must be referenced in 29 */

            /* 2 directions of the plane */
            mOutput << "#" << sid+9 << "=PLANE('',#" << sid+10 << ")" << endstr;
            mOutput << "#" << sid+10 << "=AXIS2_PLACEMENT_3D('',#" << pid1 << ", #" << sid+11 << ",#" << sid+12 << ")" << endstr;

            mOutput << "#" << sid+11 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+12 << "=DIRECTION('',(" << dv13.x << "," << dv13.y << "," << dv13.z << "))" << endstr;

            mOutput << "#" << sid+13 << "=FACE_BOUND('',#" << sid+14 << ",.T.)" << endstr;
            mOutput << "#" << sid+14 << "=EDGE_LOOP('',(#" << sid+15 << ",#" << sid+16 << ",#" << sid+17 << "))" << endstr;

            /* edge loop  */
            mOutput << "#" << sid+15 << "=ORIENTED_EDGE('',*,*,#" << sid+18 << ",.T.)" << endstr;
            mOutput << "#" << sid+16 << "=ORIENTED_EDGE('',*,*,#" << sid+19 << ",.T.)" << endstr;
            mOutput << "#" << sid+17 << "=ORIENTED_EDGE('',*,*,#" << sid+20 << ",.T.)" << endstr;

            /* oriented edges */
            mOutput << "#" << sid+18 << "=EDGE_CURVE('',#" << pid1+1 << ",#" << pid2+1 << ",#" << sid+21 << ",.F.)" << endstr;
            mOutput << "#" << sid+19 << "=EDGE_CURVE('',#" << pid2+1 << ",#" << pid3+1 << ",#" << sid+22 << ",.T.)" << endstr;
            mOutput << "#" << sid+20 << "=EDGE_CURVE('',#" << pid3+1 << ",#" << pid1+1 << ",#" << sid+23 << ",.T.)" << endstr;

            /* 3 lines and 3 vectors for the lines for the 3 edge curves */
            mOutput << "#" << sid+21 << "=LINE('',#" << pid1 << ",#" << sid+24 << ")" << endstr;
            mOutput << "#" << sid+22 << "=LINE('',#" << pid2 << ",#" << sid+25 << ")" << endstr;
            mOutput << "#" << sid+23 << "=LINE('',#" << pid3 << ",#" << sid+26 << ")" << endstr;
            mOutput << "#" << sid+24 << "=VECTOR('',#" << sid+27 << ",1.0)" << endstr;
            mOutput << "#" << sid+25 << "=VECTOR('',#" << sid+28 << ",1.0)" << endstr;
            mOutput << "#" << sid+26 << "=VECTOR('',#" << sid+29 << ",1.0)" << endstr;
            mOutput << "#" << sid+27 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+28 << "=DIRECTION('',(" << dv23.x << "," << dv23.y << "," << dv23.z << "))" << endstr;
            mOutput << "#" << sid+29 << "=DIRECTION('',(" << dv31.x << "," << dv31.y << "," << dv31.z << "))" << endstr;
            ind += faceEntryLen; // increase counter
        }
    }

    mOutput << "ENDSEC" << endstr; // end of data section
    mOutput << "END-ISO-10303-21" << endstr; // end of file
}